

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

bool __thiscall
llvm::DWARFVerifier::verifyUnitHeader
          (DWARFVerifier *this,DWARFDataExtractor DebugInfoData,uint64_t *Offset,uint UnitIndex,
          uint8_t *UnitType,bool *isUnitDWARF64)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  DWARFDebugAbbrev *this_00;
  DWARFAbbreviationDeclarationSet *pDVar4;
  raw_ostream *prVar5;
  bool local_99;
  uint64_t local_98;
  uint64_t local_90;
  format_object<unsigned_int,_unsigned_long> local_78;
  uint64_t local_58;
  uint64_t OffsetStart;
  bool local_48;
  byte local_47;
  byte local_46;
  byte local_45;
  uint16_t local_44;
  bool ValidAbbrevOffset;
  bool ValidType;
  bool ValidAddrSize;
  bool ValidVersion;
  bool ValidLength;
  bool Success;
  uint16_t Version;
  uint8_t AddrSize;
  uint64_t Length;
  uint64_t AbbrOffset;
  bool *isUnitDWARF64_local;
  uint8_t *UnitType_local;
  uint64_t *puStack_18;
  uint UnitIndex_local;
  uint64_t *Offset_local;
  DWARFVerifier *this_local;
  
  ValidType = false;
  local_45 = 1;
  local_46 = 0;
  local_47 = 0;
  local_48 = false;
  OffsetStart._7_1_ = 1;
  OffsetStart._6_1_ = 1;
  local_58 = *Offset;
  AbbrOffset = (uint64_t)isUnitDWARF64;
  isUnitDWARF64_local = (bool *)UnitType;
  UnitType_local._4_4_ = UnitIndex;
  puStack_18 = Offset;
  Offset_local = (uint64_t *)this;
  uVar2 = DataExtractor::getU32(&DebugInfoData.super_DataExtractor,Offset,(Error *)0x0);
  _ValidAddrSize = (ulong)uVar2;
  if (_ValidAddrSize == 0xffffffff) {
    _ValidAddrSize =
         DataExtractor::getU64(&DebugInfoData.super_DataExtractor,puStack_18,(Error *)0x0);
    *(undefined1 *)AbbrOffset = 1;
  }
  local_44 = DataExtractor::getU16(&DebugInfoData.super_DataExtractor,puStack_18,(Error *)0x0);
  if (local_44 < 5) {
    *isUnitDWARF64_local = false;
    if ((*(byte *)AbbrOffset & 1) == 0) {
      uVar2 = DataExtractor::getU32(&DebugInfoData.super_DataExtractor,puStack_18,(Error *)0x0);
      local_98 = (uint64_t)uVar2;
    }
    else {
      local_98 = DataExtractor::getU64(&DebugInfoData.super_DataExtractor,puStack_18,(Error *)0x0);
    }
    Length = local_98;
    ValidType = (bool)DataExtractor::getU8
                                (&DebugInfoData.super_DataExtractor,puStack_18,(Error *)0x0);
  }
  else {
    bVar1 = (bool)DataExtractor::getU8(&DebugInfoData.super_DataExtractor,puStack_18,(Error *)0x0);
    *isUnitDWARF64_local = bVar1;
    ValidType = (bool)DataExtractor::getU8
                                (&DebugInfoData.super_DataExtractor,puStack_18,(Error *)0x0);
    if ((*(byte *)AbbrOffset & 1) == 0) {
      uVar2 = DataExtractor::getU32(&DebugInfoData.super_DataExtractor,puStack_18,(Error *)0x0);
      local_90 = (uint64_t)uVar2;
    }
    else {
      local_90 = DataExtractor::getU64(&DebugInfoData.super_DataExtractor,puStack_18,(Error *)0x0);
    }
    Length = local_90;
    OffsetStart._7_1_ = dwarf::isUnitType(*isUnitDWARF64_local);
  }
  this_00 = DWARFContext::getDebugAbbrev(this->DCtx);
  pDVar4 = DWARFDebugAbbrev::getAbbreviationDeclarationSet(this_00,Length);
  if (pDVar4 == (DWARFAbbreviationDeclarationSet *)0x0) {
    OffsetStart._6_1_ = 0;
  }
  local_46 = DataExtractor::isValidOffset
                       (&DebugInfoData.super_DataExtractor,local_58 + _ValidAddrSize + 3);
  local_47 = DWARFContext::isSupportedVersion((uint)local_44);
  local_99 = ValidType == true || ValidType == true;
  local_48 = local_99;
  if (((((local_46 & 1) == 0) || (!(bool)local_47)) || (ValidType != true && ValidType != true)) ||
     (((OffsetStart._6_1_ & 1) == 0 || ((OffsetStart._7_1_ & 1) == 0)))) {
    local_45 = 0;
    prVar5 = error(this);
    format<unsigned_int,unsigned_long>
              (&local_78,(llvm *)"Units[%d] - start offset: 0x%08lx \n",
               (char *)((long)&UnitType_local + 4),(uint *)&local_58,(unsigned_long *)isUnitDWARF64)
    ;
    raw_ostream::operator<<(prVar5,&local_78.super_format_object_base);
    if ((local_46 & 1) == 0) {
      prVar5 = note(this);
      raw_ostream::operator<<
                (prVar5,"The length for this unit is too large for the .debug_info provided.\n");
    }
    if ((local_47 & 1) == 0) {
      prVar5 = note(this);
      raw_ostream::operator<<(prVar5,"The 16 bit unit header version is not valid.\n");
    }
    if ((OffsetStart._7_1_ & 1) == 0) {
      prVar5 = note(this);
      raw_ostream::operator<<(prVar5,"The unit type encoding is not valid.\n");
    }
    if ((OffsetStart._6_1_ & 1) == 0) {
      prVar5 = note(this);
      raw_ostream::operator<<(prVar5,"The offset into the .debug_abbrev section is not valid.\n");
    }
    if ((local_48 & 1U) == 0) {
      prVar5 = note(this);
      raw_ostream::operator<<(prVar5,"The address size is unsupported.\n");
    }
  }
  iVar3 = 4;
  if ((*(byte *)AbbrOffset & 1) != 0) {
    iVar3 = 0xc;
  }
  *puStack_18 = local_58 + _ValidAddrSize + (long)iVar3;
  return (bool)(local_45 & 1);
}

Assistant:

bool DWARFVerifier::verifyUnitHeader(const DWARFDataExtractor DebugInfoData,
                                     uint64_t *Offset, unsigned UnitIndex,
                                     uint8_t &UnitType, bool &isUnitDWARF64) {
  uint64_t AbbrOffset, Length;
  uint8_t AddrSize = 0;
  uint16_t Version;
  bool Success = true;

  bool ValidLength = false;
  bool ValidVersion = false;
  bool ValidAddrSize = false;
  bool ValidType = true;
  bool ValidAbbrevOffset = true;

  uint64_t OffsetStart = *Offset;
  Length = DebugInfoData.getU32(Offset);
  if (Length == dwarf::DW_LENGTH_DWARF64) {
    Length = DebugInfoData.getU64(Offset);
    isUnitDWARF64 = true;
  }
  Version = DebugInfoData.getU16(Offset);

  if (Version >= 5) {
    UnitType = DebugInfoData.getU8(Offset);
    AddrSize = DebugInfoData.getU8(Offset);
    AbbrOffset = isUnitDWARF64 ? DebugInfoData.getU64(Offset) : DebugInfoData.getU32(Offset);
    ValidType = dwarf::isUnitType(UnitType);
  } else {
    UnitType = 0;
    AbbrOffset = isUnitDWARF64 ? DebugInfoData.getU64(Offset) : DebugInfoData.getU32(Offset);
    AddrSize = DebugInfoData.getU8(Offset);
  }

  if (!DCtx.getDebugAbbrev()->getAbbreviationDeclarationSet(AbbrOffset))
    ValidAbbrevOffset = false;

  ValidLength = DebugInfoData.isValidOffset(OffsetStart + Length + 3);
  ValidVersion = DWARFContext::isSupportedVersion(Version);
  ValidAddrSize = AddrSize == 4 || AddrSize == 8;
  if (!ValidLength || !ValidVersion || !ValidAddrSize || !ValidAbbrevOffset ||
      !ValidType) {
    Success = false;
    error() << format("Units[%d] - start offset: 0x%08" PRIx64 " \n", UnitIndex,
                      OffsetStart);
    if (!ValidLength)
      note() << "The length for this unit is too "
                "large for the .debug_info provided.\n";
    if (!ValidVersion)
      note() << "The 16 bit unit header version is not valid.\n";
    if (!ValidType)
      note() << "The unit type encoding is not valid.\n";
    if (!ValidAbbrevOffset)
      note() << "The offset into the .debug_abbrev section is "
                "not valid.\n";
    if (!ValidAddrSize)
      note() << "The address size is unsupported.\n";
  }
  *Offset = OffsetStart + Length + (isUnitDWARF64 ? 12 : 4);
  return Success;
}